

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O1

Instruction * __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::CreateCompositeConstructForComponentOfLoad
          (InterfaceVariableScalarReplacement *this,Instruction *load,uint32_t depth_to_component)

{
  IRContext *pIVar1;
  DefUseManager *def_use_mgr;
  ulong uVar2;
  __node_base_ptr p_Var3;
  Instruction *pIVar4;
  bool bVar5;
  size_t sVar6;
  uint32_t uVar7;
  uint32_t res_id;
  Instruction *pIVar8;
  __node_base_ptr p_Var9;
  _Hash_node_base *p_Var10;
  ulong uVar11;
  __node_base_ptr p_Var12;
  __hashtable *__h;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  new_composite_construct;
  string message;
  spv_position_t local_78;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_58;
  
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  def_use_mgr = (pIVar1->def_use_mgr_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl
  ;
  uVar7 = 0;
  if (load->has_type_id_ == true) {
    uVar7 = Instruction::GetSingleWordOperand(load,0);
  }
  if (depth_to_component != 0) {
    uVar7 = 0;
    if (load->has_type_id_ == true) {
      uVar7 = Instruction::GetSingleWordOperand(load,0);
    }
    uVar7 = anon_unknown_0::GetComponentTypeOfArrayMatrix(def_use_mgr,uVar7,depth_to_component);
  }
  pIVar1 = (this->super_Pass).context_;
  res_id = Module::TakeNextIdBound
                     ((pIVar1->module_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                      .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
  if ((res_id == 0) && ((pIVar1->consumer_).super__Function_base._M_manager != (_Manager_type)0x0))
  {
    local_58.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)&local_58.
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_78.line = 0x25;
    local_58.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_78);
    local_58.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_78.line;
    *(undefined8 *)
     local_58.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
     _M_impl.super__Vector_impl_data._M_start = 0x667265766f204449;
    ((local_58.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_start)->words)._vptr_SmallVector =
         (_func_int **)0x797254202e776f6c;
    ((local_58.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_start)->words).size_ = 0x676e696e6e757220;
    ((local_58.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_start)->words).buffer[0].data._M_elems[0] = ' ';
    ((local_58.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_start)->words).buffer[0].data._M_elems[1] = 'c';
    ((local_58.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_start)->words).buffer[0].data._M_elems[2] = 'o';
    ((local_58.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_start)->words).buffer[0].data._M_elems[3] = 'm';
    ((local_58.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_start)->words).buffer[1].data._M_elems[0] = 'p';
    ((local_58.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_start)->words).buffer[1].data._M_elems[1] = 'a';
    ((local_58.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_start)->words).buffer[1].data._M_elems[2] = 'c';
    ((local_58.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_start)->words).buffer[1].data._M_elems[3] = 't';
    *(undefined8 *)
     (((local_58.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
        ._M_impl.super__Vector_impl_data._M_start)->words).buffer[1].data._M_elems + 1) =
         0x2e7364692d746361;
    local_58.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)local_78.line;
    *(undefined1 *)
     ((long)(((OperandData *)(local_78.line + 8))->buffer + 2) +
     (long)(&(local_58.
              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
              _M_impl.super__Vector_impl_data._M_start)->words + -1)) = 0;
    local_78.line = 0;
    local_78.column = 0;
    local_78.index = 0;
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    operator()(&pIVar1->consumer_,SPV_MSG_ERROR,"",&local_78,
               (char *)local_58.
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    if (local_58.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&local_58.
                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(local_58.
                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&(local_58.
                                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->type + 1)
                     );
    }
  }
  pIVar8 = (Instruction *)operator_new(0x70);
  local_58.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Instruction::Instruction
            (pIVar8,(this->super_Pass).context_,OpCompositeConstruct,uVar7,res_id,&local_58);
  local_78.line = (size_t)pIVar8;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_58);
  sVar6 = local_78.line;
  analysis::DefUseManager::AnalyzeInstDefUse(def_use_mgr,(Instruction *)local_78.line);
  pIVar8 = (load->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  if ((pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
    pIVar8 = (Instruction *)0x0;
  }
  do {
    uVar7 = 0;
    if (pIVar8->has_result_id_ == true) {
      uVar7 = Instruction::GetSingleWordOperand(pIVar8,(uint)pIVar8->has_type_id_);
    }
    uVar2 = (this->composite_ids_to_component_depths)._M_h._M_bucket_count;
    uVar11 = (ulong)uVar7 % uVar2;
    p_Var3 = (this->composite_ids_to_component_depths)._M_h._M_buckets[uVar11];
    p_Var9 = (__node_base_ptr)0x0;
    if ((p_Var3 != (__node_base_ptr)0x0) &&
       (p_Var9 = p_Var3, p_Var12 = p_Var3->_M_nxt, uVar7 != *(uint *)&p_Var3->_M_nxt[1]._M_nxt)) {
      while (p_Var10 = p_Var12->_M_nxt, p_Var10 != (_Hash_node_base *)0x0) {
        p_Var9 = (__node_base_ptr)0x0;
        if (((ulong)*(uint *)&p_Var10[1]._M_nxt % uVar2 != uVar11) ||
           (p_Var9 = p_Var12, p_Var12 = p_Var10, uVar7 == *(uint *)&p_Var10[1]._M_nxt))
        goto LAB_005d2759;
      }
      p_Var9 = (__node_base_ptr)0x0;
    }
LAB_005d2759:
    if (p_Var9 == (__node_base_ptr)0x0) {
      p_Var10 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var10 = p_Var9->_M_nxt;
    }
    if ((p_Var10 == (_Hash_node_base *)0x0) ||
       (*(uint *)((long)&p_Var10[1]._M_nxt + 4) <= depth_to_component)) {
      bVar5 = false;
    }
    else {
      pIVar4 = (pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      pIVar8 = (Instruction *)0x0;
      if ((pIVar4->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false) {
        pIVar8 = pIVar4;
      }
      bVar5 = true;
    }
    if (!bVar5) {
      Instruction::InsertBefore
                (pIVar8,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                         *)&local_78);
      local_58.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(depth_to_component,res_id);
      std::
      _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<std::pair<unsigned_int_const,unsigned_int>>
                ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&this->composite_ids_to_component_depths);
      if ((Instruction *)local_78.line != (Instruction *)0x0) {
        (*((IntrusiveNodeBase<spvtools::opt::Instruction> *)local_78.line)->_vptr_IntrusiveNodeBase
          [1])();
      }
      return (Instruction *)sVar6;
    }
  } while( true );
}

Assistant:

Instruction*
InterfaceVariableScalarReplacement::CreateCompositeConstructForComponentOfLoad(
    Instruction* load, uint32_t depth_to_component) {
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  uint32_t type_id = load->type_id();
  if (depth_to_component != 0) {
    type_id = GetComponentTypeOfArrayMatrix(def_use_mgr, load->type_id(),
                                            depth_to_component);
  }
  uint32_t new_id = context()->TakeNextId();
  std::unique_ptr<Instruction> new_composite_construct(new Instruction(
      context(), spv::Op::OpCompositeConstruct, type_id, new_id, {}));
  Instruction* composite_construct = new_composite_construct.get();
  def_use_mgr->AnalyzeInstDefUse(composite_construct);

  // Insert |new_composite_construct| after |load|. When there are multiple
  // recursive composite construct instructions for a load, we have to place the
  // composite construct with a lower depth later because it constructs the
  // composite that contains other composites with lower depths.
  auto* insert_before = load->NextNode();
  while (true) {
    auto itr =
        composite_ids_to_component_depths.find(insert_before->result_id());
    if (itr == composite_ids_to_component_depths.end()) break;
    if (itr->second <= depth_to_component) break;
    insert_before = insert_before->NextNode();
  }
  insert_before->InsertBefore(std::move(new_composite_construct));
  composite_ids_to_component_depths.insert({new_id, depth_to_component});
  return composite_construct;
}